

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_sorting.cpp
# Opt level: O1

void sorting::indexed(vector<Palette,_std::allocator<Palette>_> *palettes,int palSize,
                     png_color *palRGB,png_byte *palAlpha)

{
  long lVar1;
  iterator __first;
  iterator __last;
  ulong uVar2;
  Palette *pal;
  Palette *this;
  unsigned_short *__i;
  unsigned_short *__last_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp_01;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp_02;
  anon_class_16_2_17bc626a pngToRgb;
  int local_5c;
  Palette *local_58;
  anon_class_16_2_17bc626a local_50;
  png_byte *local_40;
  png_color *local_38;
  
  local_5c = palSize;
  local_40 = palAlpha;
  local_38 = palRGB;
  Options::verbosePrint(&options,'\x02',"Sorting palettes using embedded palette...\n");
  this = (palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
         super__Vector_impl_data._M_start;
  local_58 = (palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (this != local_58) {
    local_50.palRGB = &local_38;
    local_50.palAlpha = &local_40;
    do {
      __first = Palette::begin(this);
      __last = Palette::end(this);
      if (__first != __last) {
        uVar2 = (long)__last - (long)__first >> 1;
        lVar1 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        __comp._M_comp.pngToRgb = &local_50;
        __comp._M_comp.palSize = &local_5c;
        std::
        __introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                  (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,__comp);
        if ((long)__last - (long)__first < 0x21) {
          __comp_01._M_comp.pngToRgb = &local_50;
          __comp_01._M_comp.palSize = &local_5c;
          std::
          __insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                    (__first,__last,__comp_01);
        }
        else {
          __last_00 = __first + 0x10;
          __comp_00._M_comp.pngToRgb = &local_50;
          __comp_00._M_comp.palSize = &local_5c;
          std::
          __insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                    (__first,__last_00,__comp_00);
          for (; __last_00 != __last; __last_00 = __last_00 + 1) {
            __comp_02._M_comp.pngToRgb = &local_50;
            __comp_02._M_comp.palSize = &local_5c;
            std::
            __unguarded_linear_insert<unsigned_short*,__gnu_cxx::__ops::_Val_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                      (__last_00,__comp_02);
          }
        }
      }
      this = this + 1;
    } while (this != local_58);
  }
  return;
}

Assistant:

void indexed(std::vector<Palette> &palettes, int palSize, png_color const *palRGB,
             png_byte *palAlpha) {
	options.verbosePrint(Options::VERB_LOG_ACT, "Sorting palettes using embedded palette...\n");

	auto pngToRgb = [&palRGB, &palAlpha](int index) {
		auto const &c = palRGB[index];
		return Rgba(c.red, c.green, c.blue, palAlpha ? palAlpha[index] : 0xFF);
	};

	for (Palette &pal : palettes) {
		std::sort(pal.begin(), pal.end(), [&](uint16_t lhs, uint16_t rhs) {
			// Iterate through the PNG's palette, looking for either of the two
			for (int i = 0; i < palSize; ++i) {
				uint16_t color = pngToRgb(i).cgbColor();
				if (color == Rgba::transparent) {
					continue;
				}
				// Return whether lhs < rhs
				if (color == rhs) {
					return false;
				}
				if (color == lhs) {
					return true;
				}
			}
			unreachable_(); // This should not be possible
		});
	}
}